

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitLogicalCount
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,LogicalCountExpr e)

{
  char *__s;
  size_t sVar1;
  BasicWriter<char> *pBVar2;
  BasicStringRef<char> value;
  
  pBVar2 = this->writer_;
  __s = internal::ExprInfo::INFO
        [*(uint *)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_].
        str;
  sVar1 = strlen(__s);
  value.size_ = sVar1;
  value.data_ = __s;
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,value);
  fmt::BasicWriter<char>::operator<<(pBVar2,' ');
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_ +
             8))->impl_,-1);
  fmt::BasicWriter<char>::operator<<(this->writer_,' ');
  ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer>::
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            ((ExprWriter<mp::internal::ExprTypes,mp::GenericVarNamer> *)this,
             (BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>)
             *(BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *)
              &((BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_
               + 0x10))->super_ExprBase,", ",0);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitLogicalCount(LogicalCountExpr e) {
  writer_ << str(e.kind()) << ' ';
  Visit(e.lhs());
  writer_ << ' ';
  WriteArgs(e.rhs());
}